

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O0

void makeContextCurrentOSMesa(_GLFWwindow *window)

{
  int iVar1;
  void *pvVar2;
  int local_18;
  int local_14;
  int height;
  int width;
  _GLFWwindow *window_local;
  
  _height = window;
  if (window != (_GLFWwindow *)0x0) {
    _glfwPlatformGetFramebufferSize(window,&local_14,&local_18);
    if ((((_height->context).osmesa.buffer == (void *)0x0) ||
        (local_14 != (_height->context).osmesa.width)) ||
       (local_18 != (_height->context).osmesa.height)) {
      free((_height->context).osmesa.buffer);
      pvVar2 = calloc(4,(long)local_14 * (long)local_18);
      (_height->context).osmesa.buffer = pvVar2;
      (_height->context).osmesa.width = local_14;
      (_height->context).osmesa.height = local_18;
    }
    iVar1 = (*_glfw.osmesa.MakeCurrent)
                      ((_height->context).osmesa.handle,(_height->context).osmesa.buffer,0x1401,
                       local_14,local_18);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"OSMesa: Failed to make context current");
      return;
    }
  }
  _glfwPlatformSetTls(&_glfw.contextSlot,_height);
  return;
}

Assistant:

static void makeContextCurrentOSMesa(_GLFWwindow* window)
{
    if (window)
    {
        int width, height;
        _glfwPlatformGetFramebufferSize(window, &width, &height);

        // Check to see if we need to allocate a new buffer
        if ((window->context.osmesa.buffer == NULL) ||
            (width != window->context.osmesa.width) ||
            (height != window->context.osmesa.height))
        {
            free(window->context.osmesa.buffer);

            // Allocate the new buffer (width * height * 8-bit RGBA)
            window->context.osmesa.buffer = calloc(4, (size_t) width * height);
            window->context.osmesa.width  = width;
            window->context.osmesa.height = height;
        }

        if (!OSMesaMakeCurrent(window->context.osmesa.handle,
                               window->context.osmesa.buffer,
                               GL_UNSIGNED_BYTE,
                               width, height))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "OSMesa: Failed to make context current");
            return;
        }
    }

    _glfwPlatformSetTls(&_glfw.contextSlot, window);
}